

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_5278::StreambufStream::write
          (StreambufStream *this,int __fd,void *__buf,size_t __n)

{
  ktxStream *pkVar1;
  ktxStream_skip p_Var2;
  ssize_t sVar3;
  ostream *poVar4;
  long lVar5;
  undefined4 in_register_00000034;
  
  sVar3 = 0;
  if (__n != 0 && __buf != (void *)0x0) {
    pkVar1 = this[1]._stream._M_t.super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>.
             _M_t.super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
             super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl;
    poVar4 = std::operator<<((ostream *)&std::cerr,"\t write: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"*");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"B");
    std::endl<char,std::char_traits<char>>(poVar4);
    p_Var2 = pkVar1->skip;
    lVar5 = (**(code **)(*(long *)p_Var2 + 0x60))
                      (p_Var2,CONCAT44(in_register_00000034,__fd),__n * (long)__buf);
    sVar3 = (ulong)(lVar5 != __n * (long)__buf) << 3;
  }
  return sVar3;
}

Assistant:

static KTX_error_code write(ktxStream* str, const void* src, ktx_size_t size, ktx_size_t count)
    {
        auto self = parent(str);
        if (size == 0 || count == 0)
        {
            return KTX_SUCCESS;
        }
        std::cerr << "\t write: " << count << "*" << size << "B" << std::endl;

        const auto ntotal = std::streamsize(size * count);
        const std::streamsize nput = self->_streambuf->sputn(reinterpret_cast<const char*>(src), ntotal);
        return (nput == ntotal) ? KTX_SUCCESS : KTX_FILE_WRITE_ERROR;
    }